

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O2

list_elem * list_remove(list *list,list_elem *e)

{
  list_elem *plVar1;
  list_elem *plVar2;
  
  if (e != (list_elem *)0x0) {
    plVar1 = e->prev;
    plVar2 = e->next;
    if (plVar2 != (list_elem *)0x0) {
      plVar2->prev = plVar1;
    }
    if (plVar1 != (list_elem *)0x0) {
      plVar1->next = plVar2;
    }
    if (list->head == e) {
      list->head = e->next;
    }
    if (list->tail == e) {
      list->tail = plVar1;
    }
    return e->next;
  }
  return (list_elem *)0x0;
}

Assistant:

struct list_elem *list_remove(struct list *list, struct list_elem *e)
{
    IFDEF_LOCK( spin_lock(&list->lock); );
    if (e) {
        // if not NULL
        if (e->next) e->next->prev = e->prev;
        if (e->prev) e->prev->next = e->next;

        if (list->head == e) list->head = e->next;
        if (list->tail == e) list->tail = e->prev;

        struct list_elem *next = e->next;

        IFDEF_LOCK( spin_unlock(&list->lock); );
        return next;
    }
    // NULL .. do nothing
    IFDEF_LOCK( spin_unlock(&list->lock); );
    return NULL;
}